

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::sectionStarting
          (CumulativeReporterBase<Catch::JunitReporter> *this,SectionInfo *sectionInfo)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
  *p_Var4;
  SectionNode *pSVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  size_t sVar7;
  size_t sVar8;
  __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  _Var9;
  SectionStats incompleteStats;
  undefined1 local_c9;
  SectionNode *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  Counts local_b8;
  SectionStats local_98;
  
  local_b8.passed = 0;
  local_b8.failed = 0;
  local_b8.failedButOk = 0;
  SectionStats::SectionStats(&local_98,sectionInfo,&local_b8,0.0,false);
  local_b8.passed = 0;
  local_b8.failed = 0;
  psVar1 = (this->m_sectionStack).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start == psVar1) {
    if ((this->m_rootSection).
        super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      local_c8 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,std::allocator<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,Catch::SectionStats&>
                (&_Stack_c0,&local_c8,
                 (allocator<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                 &local_c9,&local_98);
      _Var6._M_pi = _Stack_c0._M_pi;
      pSVar5 = local_c8;
      local_c8 = (SectionNode *)0x0;
      _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (this->m_rootSection).
               super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (this->m_rootSection).
      super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = pSVar5;
      (this->m_rootSection).
      super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var6._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
      }
    }
    local_b8.passed =
         (size_t)(this->m_rootSection).
                 super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
    p_Var4 = &(this->m_rootSection).
              super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  else {
    peVar2 = psVar1[-1].
             super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_c8 = (SectionNode *)sectionInfo;
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>*,std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>>>>,__gnu_cxx::__ops::_Iter_pred<Catch::CumulativeReporterBase<Catch::JunitReporter>::BySectionInfo>>
                      ((peVar2->childSections).
                       super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (peVar2->childSections).
                       super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (_Var9._M_current ==
        (peVar2->childSections).
        super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_c8 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,std::allocator<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,Catch::SectionStats&>
                (&_Stack_c0,&local_c8,
                 (allocator<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                 &local_c9,&local_98);
      sVar7 = local_b8.failed;
      local_b8.failed = (size_t)_Stack_c0._M_pi;
      local_b8.passed = (size_t)local_c8;
      local_c8 = (SectionNode *)0x0;
      _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar7);
      }
      if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
      }
      clara::std::
      vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
      ::push_back(&peVar2->childSections,(value_type *)&local_b8);
      goto LAB_0014628e;
    }
    local_b8.passed =
         (size_t)((_Var9._M_current)->
                 super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
    p_Var4 = &(_Var9._M_current)->
              super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.failed,&p_Var4->_M_refcount);
LAB_0014628e:
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::push_back(&this->m_sectionStack,(value_type *)&local_b8);
  sVar8 = local_b8.failed;
  sVar7 = local_b8.passed;
  local_b8.passed = 0;
  local_b8.failed = 0;
  p_Var3 = (this->m_deepestSection).
           super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_deepestSection).
  super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)sVar7;
  (this->m_deepestSection).
  super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.failed !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.failed);
  }
  SectionStats::~SectionStats(&local_98);
  return;
}

Assistant:

void sectionStarting( SectionInfo const& sectionInfo ) override {
            SectionStats incompleteStats( sectionInfo, Counts(), 0, false );
            std::shared_ptr<SectionNode> node;
            if( m_sectionStack.empty() ) {
                if( !m_rootSection )
                    m_rootSection = std::make_shared<SectionNode>( incompleteStats );
                node = m_rootSection;
            }
            else {
                SectionNode& parentNode = *m_sectionStack.back();
                auto it =
                    std::find_if(   parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
                if( it == parentNode.childSections.end() ) {
                    node = std::make_shared<SectionNode>( incompleteStats );
                    parentNode.childSections.push_back( node );
                }
                else
                    node = *it;
            }
            m_sectionStack.push_back( node );
            m_deepestSection = std::move(node);
        }